

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O0

void push_layout(mu_Context *ctx,mu_Rect body,mu_Vec2 scroll)

{
  mu_Rect mVar1;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  int width;
  mu_Layout layout;
  mu_Context *ctx_local;
  mu_Vec2 scroll_local;
  mu_Rect body_local;
  
  local_c0._8_4_ = 0;
  layout._132_8_ = ctx;
  memset(local_c0 + 0xc,0,0x8c);
  scroll_local.x = body.x;
  ctx_local._0_4_ = scroll.x;
  scroll_local.y = body.y;
  ctx_local._4_4_ = scroll.y;
  body_local.x = body.w;
  body_local.y = body.h;
  mVar1 = mu_rect(scroll_local.x - (int)ctx_local,scroll_local.y - ctx_local._4_4_,body_local.x,
                  body_local.y);
  local_c8 = mVar1._0_8_;
  stack0xffffffffffffff4c = local_c8;
  local_c0._0_8_ = mVar1._8_8_;
  layout.body.x = local_c0._0_4_;
  layout.body.y = local_c0._4_4_;
  layout.size = mu_vec2(-0x1000000,-0x1000000);
  if (0xf < *(int *)(layout._132_8_ + 0x405e0)) {
    fprintf(_stderr,"Fatal error: %s:%d: assertion \'%s\' failed\n",
            "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/microui/microui.c"
            ,0x11a,
            "(ctx->layout_stack).idx < (int) (sizeof((ctx->layout_stack).items) / sizeof(*(ctx->layout_stack).items))"
           );
    abort();
  }
  memcpy((void *)(layout._132_8_ + 0x405e4 + (long)*(int *)(layout._132_8_ + 0x405e0) * 0x8c),
         local_c0 + 0xc,0x8c);
  *(int *)(layout._132_8_ + 0x405e0) = *(int *)(layout._132_8_ + 0x405e0) + 1;
  mu_layout_row((mu_Context *)layout._132_8_,1,(int *)(local_c0 + 8),0);
  return;
}

Assistant:

static void push_layout(mu_Context *ctx, mu_Rect body, mu_Vec2 scroll) {
  mu_Layout layout;
  int width = 0;
  memset(&layout, 0, sizeof(layout));
  layout.body = mu_rect(body.x - scroll.x, body.y - scroll.y, body.w, body.h);
  layout.max = mu_vec2(-0x1000000, -0x1000000);
  push(ctx->layout_stack, layout);
  mu_layout_row(ctx, 1, &width, 0);
}